

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::GetKeyFromPool
          (LegacyScriptPubKeyMan *this,CPubKey *result,OutputType type)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  WalletDatabase *pWVar6;
  bool bVar7;
  long in_FS_OFFSET;
  WalletBatch local_f0;
  int64_t nIndex;
  OutputType type_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  CPubKey local_b9;
  CKeyPool keypool;
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  type_local = type;
  if (type == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x592,
                  "bool wallet::LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey &, const OutputType)")
    ;
  }
  bVar7 = false;
  iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xd])(this,0);
  if ((char)iVar5 == '\0') goto LAB_0095ce53;
  CKeyPool::CKeyPool(&keypool);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock45,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x599,false);
  bVar3 = ReserveKeyFromKeyPool(this,&nIndex,&keypool,false);
  if (bVar3) {
LAB_0095cda7:
    (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[7])
              (this,nIndex,&type_local);
    memcpy(result,&keypool.vchPubKey,0x41);
    bVar4 = 1;
  }
  else {
    pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar5 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
    if ((char)iVar5 != '\0') goto LAB_0095cda7;
    iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
              [10])();
    if ((char)iVar5 == '\0') {
      iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage
                [3])();
      pWVar6 = (WalletDatabase *)CONCAT44(extraout_var,iVar5);
      (*pWVar6->_vptr_WalletDatabase[0xe])(&local_f0,pWVar6,1);
      local_f0.m_database = pWVar6;
      GenerateNewKey(&local_b9,this,&local_f0,&(this->super_LegacyDataSPKM).m_hd_chain,false);
      memcpy(result,&local_b9,0x41);
      if (local_f0.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(*(_func_int ***)
            local_f0.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
      }
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
    bVar4 = 0;
  }
  bVar7 = (bool)(bVar7 | bVar4);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock45.super_unique_lock);
LAB_0095ce53:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey& result, const OutputType type)
{
    assert(type != OutputType::BECH32M);
    if (!CanGetAddresses(/*internal=*/ false)) {
        return false;
    }

    CKeyPool keypool;
    {
        LOCK(cs_KeyStore);
        int64_t nIndex;
        if (!ReserveKeyFromKeyPool(nIndex, keypool, /*fRequestedInternal=*/ false) && !m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
            if (m_storage.IsLocked()) return false;
            WalletBatch batch(m_storage.GetDatabase());
            result = GenerateNewKey(batch, m_hd_chain, /*internal=*/ false);
            return true;
        }
        KeepDestination(nIndex, type);
        result = keypool.vchPubKey;
    }
    return true;
}